

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int generate_by_descriptor_addr
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -2;
  if ((script_len != 0 && node->child != (miniscript_node_t *)0x0) &&
     ((parent == (miniscript_node_t *)0x0 || (parent->info != (miniscript_item_t *)0x0)))) {
    iVar1 = generate_script_from_miniscript
                      (node->child,node,derive_child_num,script,script_len,write_len);
    iVar2 = -2;
    if (*write_len < 0x209) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

static int generate_by_descriptor_addr(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    if (!node->child || (script_len == 0) || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(
        node->child, node, derive_child_num, script, script_len, write_len);
    if (*write_len > DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE)
        return WALLY_EINVAL;

    return ret;
}